

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing-utils.c
# Opt level: O3

_Bool str_to_double(char *string,double *out)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  int *piVar4;
  bool bVar5;
  double dVar6;
  char *endptr;
  char *local_38;
  
  sVar3 = strlen(string);
  if (sVar3 == 0) {
    bVar5 = false;
  }
  else {
    bVar5 = (string[sVar3 - 1] & 0xdfU) == 0x46;
  }
  local_38 = (char *)0x0;
  piVar4 = __errno_location();
  *piVar4 = 0;
  dVar6 = strtod(string,&local_38);
  if ((sVar3 == 0) || (*piVar4 == 0x22)) {
    bVar2 = false;
  }
  else {
    bVar2 = local_38 != (char *)0x0 && local_38 != string;
  }
  if (*local_38 == '\0') {
    bVar1 = 1;
  }
  else {
    bVar1 = bVar5 & local_38 == string + (sVar3 - 1);
  }
  if (!(bool)(bVar2 & bVar1)) {
    dVar6 = NAN;
  }
  *out = dVar6;
  return (_Bool)(bVar2 & bVar1);
}

Assistant:

bool str_to_double(const char *string, double *out) {
    size_t len = strlen(string);

    bool terminating_f =
        len >= 1 && (string[len - 1] == 'f' || string[len - 1] == 'F');

    char *endptr = NULL;

    errno = 0;
    double conv_ret_val = strtod(string, &endptr);

    bool out_of_range = (errno == ERANGE);
    bool failed =
        len == 0 || out_of_range || endptr == string || endptr == NULL;

    bool valid_endptr =
        *endptr == '\0' || (terminating_f && endptr == string + len - 1);
    bool result = !failed && valid_endptr;

    if (result) {
        *out = conv_ret_val;
    } else {
        *out = NAN;
    }

    return result;
}